

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O0

ostream * operator<<(ostream *os,substring *ss)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 *in_RSI;
  ostream *in_RDI;
  string s;
  allocator local_31;
  string local_30 [40];
  ostream *local_8;
  
  pcVar1 = (char *)*in_RSI;
  lVar2 = in_RSI[1];
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,lVar2 - (long)pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar3 = std::operator<<(local_8,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const substring& ss)
{
  std::string s(ss.begin, ss.end - ss.begin);
  return os << s;
}